

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  undefined8 uVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  difference_type __d;
  
  uVar1 = *(undefined8 *)(this + 0x10);
  lVar2 = *state;
  for (uVar7 = 0; uVar7 < *(uint *)(this + 0xc); uVar7 = uVar7 + 1) {
    cVar3 = (**(code **)(**(long **)this + 0x10))(*(long **)this,state);
    if (cVar3 == '\0') break;
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,mpl_::bool_<true>>
       )0x1) {
    lVar5 = (ulong)(state[4] != lVar2) + lVar2;
    lVar6 = lVar5;
    if (uVar7 < *(uint *)(this + 0xc)) {
      lVar6 = *state;
    }
    if (uVar7 != 0) {
      lVar5 = lVar6;
    }
    state[0x12] = lVar5;
  }
  if (uVar7 < *(uint *)(this + 8)) {
LAB_0012434f:
    *state = lVar2;
    bVar4 = false;
  }
  else {
    while( true ) {
      cVar3 = (**(code **)(*next + 0x10))(next,state);
      if (cVar3 != '\0') break;
      if (uVar7 == *(uint *)(this + 8)) goto LAB_0012434f;
      uVar7 = uVar7 - 1;
      *state = *state + (long)-(int)uVar1;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }